

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O0

StreamSep * __thiscall Hpipe::StreamSep::operator<<(StreamSep *this,char (*val) [41])

{
  ostream *poVar1;
  char (*val_local) [41];
  StreamSep *this_local;
  
  poVar1 = std::operator<<(this->stream,(string *)&this->sep);
  std::operator<<(poVar1,*val);
  return this;
}

Assistant:

StreamSep &operator<<( const T &val ) {
        *stream << sep << val;
        return *this;
    }